

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_idx(cmd_code code)

{
  ulong local_18;
  size_t i;
  cmd_code code_local;
  
  local_18 = 0;
  while( true ) {
    if (0x70 < local_18) {
      return L'\xffffffff';
    }
    if (game_cmds[local_18].cmd == code) break;
    local_18 = local_18 + 1;
  }
  return (wchar_t)local_18;
}

Assistant:

static int cmd_idx(cmd_code code)
{
	size_t i;

	for (i = 0; i < N_ELEMENTS(game_cmds); i++)
		if (game_cmds[i].cmd == code)
			return i;

	return CMD_ARG_NOT_PRESENT;
}